

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O0

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  undefined8 in_RCX;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict op;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict name;
  int **local_80;
  undefined8 local_78;
  int *local_70;
  undefined8 *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  char *local_30;
  undefined8 local_28;
  long local_10;
  sexp_conflict local_8;
  
  local_40 = 0x43e;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  memset(&local_50,0,0x10);
  local_58 = 0x43e;
  memset(&local_68,0,0x10);
  local_70 = (int *)0x43e;
  memset(&local_80,0,0x10);
  iVar1 = strcmp(local_30,"0.11.0");
  if ((iVar1 == 0) && (iVar1 = strncmp(local_38,"cv-gm*uh",8), iVar1 == 0)) {
    local_50 = &local_40;
    local_48 = *(undefined8 *)(local_10 + 0x6080);
    *(undefined8 ***)(local_10 + 0x6080) = &local_50;
    local_68 = &local_58;
    local_60 = *(undefined8 *)(local_10 + 0x6080);
    *(undefined8 ***)(local_10 + 0x6080) = &local_68;
    local_80 = &local_70;
    local_78 = *(undefined8 *)(local_10 + 0x6080);
    *(int ****)(local_10 + 0x6080) = &local_80;
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"%utf32->string",3,1,
                                 "sexp_25_utf32_3e_string_stub",sexp_25_utf32_3e_string_stub,0x13e);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 1;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_70 + 0x12) = uVar2;
      *(undefined8 *)(*(long *)(local_70 + 0x12) + 0x18) = 0xb;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"%utf16->string",3,1,
                                 "sexp_25_utf16_3e_string_stub",sexp_25_utf16_3e_string_stub,0x13e);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 1;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_70 + 0x12) = uVar2;
      *(undefined8 *)(*(long *)(local_70 + 0x12) + 0x18) = 0xb;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"%string->utf32",2,1,
                                 "sexp_25_string_3e_utf32_stub",sexp_25_string_3e_utf32_stub,
                                 *(undefined8 *)(*(long *)(local_10 + 0x28) + 0x18));
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 1;
      local_70[0xb] = 0;
      local_70[0xe] = 0x13;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_70 + 0x12) = uVar2;
      *(undefined8 *)(*(long *)(local_70 + 0x12) + 0x10) = 5;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"%string->utf16",2,1,
                                 "sexp_25_string_3e_utf16_stub",sexp_25_string_3e_utf16_stub,
                                 *(undefined8 *)(*(long *)(local_10 + 0x28) + 0x18));
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 1;
      local_70[0xb] = 0;
      local_70[0xe] = 0x13;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-ieee-double-set!",4,0,
                                 "sexp_bytevector_ieee_double_set_x_stub",
                                 sexp_bytevector_ieee_double_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_70 + 0x12) = uVar2;
      *(undefined8 *)(*(long *)(local_70 + 0x12) + 0x10) = 0x17;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-ieee-double-ref",3,0,
                                 "sexp_bytevector_ieee_double_ref_stub",
                                 sexp_bytevector_ieee_double_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x17;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-ieee-double-native-set!",3,0,
                                 "sexp_bytevector_ieee_double_native_set_x_stub",
                                 sexp_bytevector_ieee_double_native_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 0x17;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-ieee-double-native-ref",2,0,
                                 "sexp_bytevector_ieee_double_native_ref_stub",
                                 sexp_bytevector_ieee_double_native_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x17;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-ieee-single-set!",4,0,
                                 "sexp_bytevector_ieee_single_set_x_stub",
                                 sexp_bytevector_ieee_single_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_70 + 0x12) = uVar2;
      *(undefined8 *)(*(long *)(local_70 + 0x12) + 0x10) = 0x17;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-ieee-single-ref",3,0,
                                 "sexp_bytevector_ieee_single_ref_stub",
                                 sexp_bytevector_ieee_single_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x17;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-ieee-single-native-set!",3,0,
                                 "sexp_bytevector_ieee_single_native_set_x_stub",
                                 sexp_bytevector_ieee_single_native_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 0x17;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-ieee-single-native-ref",2,0,
                                 "sexp_bytevector_ieee_single_native_ref_stub",
                                 sexp_bytevector_ieee_single_native_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x17;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u64-set!",4,0,
                                 "sexp_bytevector_u64_set_x_stub",sexp_bytevector_u64_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_70 + 0x12) = uVar2;
      *(undefined8 *)(*(long *)(local_70 + 0x12) + 0x10) = 5;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u64-ref",3,0,
                                 "sexp_bytevector_u64_ref_stub",sexp_bytevector_u64_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u64-native-set!",3,0,
                                 "sexp_bytevector_u64_native_set_x_stub",
                                 sexp_bytevector_u64_native_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u64-native-ref",2,0,
                                 "sexp_bytevector_u64_native_ref_stub",
                                 sexp_bytevector_u64_native_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u32-set!",4,0,
                                 "sexp_bytevector_u32_set_x_stub",sexp_bytevector_u32_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_70 + 0x12) = uVar2;
      *(undefined8 *)(*(long *)(local_70 + 0x12) + 0x10) = 5;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u32-ref",3,0,
                                 "sexp_bytevector_u32_ref_stub",sexp_bytevector_u32_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u32-native-set!",3,0,
                                 "sexp_bytevector_u32_native_set_x_stub",
                                 sexp_bytevector_u32_native_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u32-native-ref",2,0,
                                 "sexp_bytevector_u32_native_ref_stub",
                                 sexp_bytevector_u32_native_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u16-set!",4,0,
                                 "sexp_bytevector_u16_set_x_stub",sexp_bytevector_u16_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_70 + 0x12) = uVar2;
      *(undefined8 *)(*(long *)(local_70 + 0x12) + 0x10) = 5;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u16-ref",3,0,
                                 "sexp_bytevector_u16_ref_stub",sexp_bytevector_u16_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u16-native-set!",3,0,
                                 "sexp_bytevector_u16_native_set_x_stub",
                                 sexp_bytevector_u16_native_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-u16-native-ref",2,0,
                                 "sexp_bytevector_u16_native_ref_stub",
                                 sexp_bytevector_u16_native_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s64-set!",4,0,
                                 "sexp_bytevector_s64_set_x_stub",sexp_bytevector_s64_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_70 + 0x12) = uVar2;
      *(undefined8 *)(*(long *)(local_70 + 0x12) + 0x10) = 5;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s64-ref",3,0,
                                 "sexp_bytevector_s64_ref_stub",sexp_bytevector_s64_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s64-native-set!",3,0,
                                 "sexp_bytevector_s64_native_set_x_stub",
                                 sexp_bytevector_s64_native_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s64-native-ref",2,0,
                                 "sexp_bytevector_s64_native_ref_stub",
                                 sexp_bytevector_s64_native_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s32-set!",4,0,
                                 "sexp_bytevector_s32_set_x_stub",sexp_bytevector_s32_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_70 + 0x12) = uVar2;
      *(undefined8 *)(*(long *)(local_70 + 0x12) + 0x10) = 5;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s32-ref",3,0,
                                 "sexp_bytevector_s32_ref_stub",sexp_bytevector_s32_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s32-native-set!",3,0,
                                 "sexp_bytevector_s32_native_set_x_stub",
                                 sexp_bytevector_s32_native_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s32-native-ref",2,0,
                                 "sexp_bytevector_s32_native_ref_stub",
                                 sexp_bytevector_s32_native_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s16-set!",4,0,
                                 "sexp_bytevector_s16_set_x_stub",sexp_bytevector_s16_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
      uVar2 = sexp_make_vector_op(local_10,0,2,5,1);
      *(undefined8 *)(local_70 + 0x12) = uVar2;
      *(undefined8 *)(*(long *)(local_70 + 0x12) + 0x10) = 5;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s16-ref",3,0,
                                 "sexp_bytevector_s16_ref_stub",sexp_bytevector_s16_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xe] = 0x11;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s16-native-set!",3,0,
                                 "sexp_bytevector_s16_native_set_x_stub",
                                 sexp_bytevector_s16_native_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s16-native-ref",2,0,
                                 "sexp_bytevector_s16_native_ref_stub",
                                 sexp_bytevector_s16_native_ref_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 5;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
    }
    local_70 = (int *)sexp_define_foreign_aux
                                (local_10,local_28,"bytevector-s8-set!",3,0,
                                 "sexp_bytevector_s8_set_x_stub",sexp_bytevector_s8_set_x_stub,0);
    if ((((ulong)local_70 & 3) == 0) && (*local_70 == 0x1b)) {
      local_70[10] = 0x43e;
      local_70[0xb] = 0;
      local_70[0xc] = 0x11;
      local_70[0xd] = 0;
      local_70[0xe] = 5;
      local_70[0xf] = 0;
      local_70[0x10] = 5;
      local_70[0x11] = 0;
    }
    piVar3 = (int *)sexp_define_foreign_aux
                              (local_10,local_28,"bytevector-s8-ref",2,0,
                               "sexp_bytevector_s8_ref_stub",sexp_bytevector_s8_ref_stub,0);
    if ((((ulong)piVar3 & 3) == 0) && (*piVar3 == 0x1b)) {
      piVar3[10] = 5;
      piVar3[0xb] = 0;
      piVar3[0xc] = 0x11;
      piVar3[0xd] = 0;
      piVar3[0xe] = 5;
      piVar3[0xf] = 0;
    }
    *(undefined8 *)(local_10 + 0x6080) = local_48;
    local_8 = (sexp_conflict)0x43e;
  }
  else {
    local_8 = (sexp_conflict)0xb3e;
  }
  return local_8;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  op = sexp_define_foreign_opt(ctx, env, "%utf32->string", 3, sexp_25_utf32_3e_string_stub, sexp_make_boolean(SEXP_FALSE));
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_BOOLEAN));
  }
  op = sexp_define_foreign_opt(ctx, env, "%utf16->string", 3, sexp_25_utf16_3e_string_stub, sexp_make_boolean(SEXP_FALSE));
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ONE, sexp_make_fixnum(SEXP_BOOLEAN));
  }
  op = sexp_define_foreign_opt(ctx, env, "%string->utf32", 2, sexp_25_string_3e_utf32_stub, sexp_global(ctx, SEXP_G_ENDIANNESS));
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign_opt(ctx, env, "%string->utf16", 2, sexp_25_string_3e_utf16_stub, sexp_global(ctx, SEXP_G_ENDIANNESS));
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_OBJECT);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_STRING);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-double-set!", 4, sexp_bytevector_ieee_double_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FLONUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-double-ref", 3, sexp_bytevector_ieee_double_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-double-native-set!", 3, sexp_bytevector_ieee_double_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-double-native-ref", 2, sexp_bytevector_ieee_double_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-single-set!", 4, sexp_bytevector_ieee_single_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FLONUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-single-ref", 3, sexp_bytevector_ieee_single_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-single-native-set!", 3, sexp_bytevector_ieee_single_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FLONUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-ieee-single-native-ref", 2, sexp_bytevector_ieee_single_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FLONUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u64-set!", 4, sexp_bytevector_u64_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u64-ref", 3, sexp_bytevector_u64_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u64-native-set!", 3, sexp_bytevector_u64_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u64-native-ref", 2, sexp_bytevector_u64_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u32-set!", 4, sexp_bytevector_u32_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u32-ref", 3, sexp_bytevector_u32_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u32-native-set!", 3, sexp_bytevector_u32_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u32-native-ref", 2, sexp_bytevector_u32_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u16-set!", 4, sexp_bytevector_u16_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u16-ref", 3, sexp_bytevector_u16_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u16-native-set!", 3, sexp_bytevector_u16_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-u16-native-ref", 2, sexp_bytevector_u16_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s64-set!", 4, sexp_bytevector_s64_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s64-ref", 3, sexp_bytevector_s64_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s64-native-set!", 3, sexp_bytevector_s64_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s64-native-ref", 2, sexp_bytevector_s64_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s32-set!", 4, sexp_bytevector_s32_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s32-ref", 3, sexp_bytevector_s32_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s32-native-set!", 3, sexp_bytevector_s32_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s32-native-ref", 2, sexp_bytevector_s32_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s16-set!", 4, sexp_bytevector_s16_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_argn_type(op) = sexp_make_vector(ctx, SEXP_TWO, sexp_make_fixnum(SEXP_OBJECT));
    sexp_vector_set(sexp_opcode_argn_type(op), SEXP_ZERO, sexp_make_fixnum(SEXP_FIXNUM));
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s16-ref", 3, sexp_bytevector_s16_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s16-native-set!", 3, sexp_bytevector_s16_native_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s16-native-ref", 2, sexp_bytevector_s16_native_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s8-set!", 3, sexp_bytevector_s8_set_x_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = SEXP_VOID;
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg3_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  op = sexp_define_foreign(ctx, env, "bytevector-s8-ref", 2, sexp_bytevector_s8_ref_stub);
  if (sexp_opcodep(op)) {
    sexp_opcode_return_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
    sexp_opcode_arg1_type(op) = sexp_make_fixnum(SEXP_BYTES);
    sexp_opcode_arg2_type(op) = sexp_make_fixnum(SEXP_FIXNUM);
  }
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}